

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_filesystem_joinPath(sysbvm_context_t *context,sysbvm_tuple_t left,sysbvm_tuple_t right)

{
  _Bool _Var1;
  uint8_t *__n;
  size_t __n_00;
  _Bool *__dest;
  bool bVar2;
  uint8_t *destBytes;
  size_t destIndex;
  sysbvm_tuple_t result;
  size_t resultSize;
  uint8_t lastCharacter;
  _Bool hasSeparator;
  uint8_t *rightBytes;
  size_t rightSize;
  uint8_t *leftBytes;
  size_t leftSize;
  sysbvm_tuple_t right_local;
  sysbvm_tuple_t left_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_filesystem_isAbsolute(right);
  context_local = (sysbvm_context_t *)right;
  if (((!_Var1) && (_Var1 = sysbvm_tuple_isBytes(left), _Var1)) &&
     (_Var1 = sysbvm_tuple_isBytes(right), _Var1)) {
    __n = (uint8_t *)sysbvm_tuple_getSizeInBytes(left);
    __n_00 = sysbvm_tuple_getSizeInBytes(right);
    bVar2 = false;
    if (__n != (uint8_t *)0x0) {
      bVar2 = *(uint8_t *)((long)(left + 0x10) + (long)(__n + -1)) == '/';
    }
    context_local =
         (sysbvm_context_t *)
         sysbvm_string_createEmptyWithSize(context,(size_t)(__n + __n_00 + (long)(int)(uint)!bVar2))
    ;
    __dest = &(context_local->heap).shouldAttemptToCollect;
    memcpy(__dest,(void *)(left + 0x10),(size_t)__n);
    destBytes = __n;
    if (!bVar2) {
      destBytes = __n + 1;
      __dest[(long)__n] = true;
    }
    memcpy(__dest + (long)destBytes,(void *)(right + 0x10),__n_00);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_filesystem_joinPath(sysbvm_context_t *context, sysbvm_tuple_t left, sysbvm_tuple_t right)
{
    if(sysbvm_filesystem_isAbsolute(right) || !sysbvm_tuple_isBytes(left) || !sysbvm_tuple_isBytes(right))
        return right;

    size_t leftSize = sysbvm_tuple_getSizeInBytes(left);
    uint8_t *leftBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(left)->bytes;

    size_t rightSize = sysbvm_tuple_getSizeInBytes(right);
    uint8_t *rightBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(right)->bytes;

    bool hasSeparator = false;
    if(leftSize > 0)
    {
        uint8_t lastCharacter = leftBytes[leftSize - 1];
#ifdef _WIN32
        hasSeparator = lastCharacter == '/' || lastCharacter == '\\';
#else
        hasSeparator = lastCharacter == '/';
#endif
    }

    size_t resultSize = leftSize + (hasSeparator ? 0 : 1) + rightSize;
    sysbvm_tuple_t result = sysbvm_string_createEmptyWithSize(context, resultSize);

    size_t destIndex = 0;
    uint8_t *destBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(result)->bytes;

    memcpy(destBytes, leftBytes, leftSize);
    destIndex += leftSize;

    if(!hasSeparator)
        destBytes[destIndex++] = '/';

    memcpy(destBytes + destIndex, rightBytes, rightSize);
    return result;
}